

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_18e2c8::HamtRoundTrip::HamtRoundTrip(HamtRoundTrip *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HamtRoundTrip_002736f0;
  in_memory_store::in_memory_store(&this->store_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,&(this->store_).file_,true);
  return;
}

Assistant:

HamtRoundTrip ()
                : db_{store_.file ()} {}